

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

DAngle P_BulletSlope(AActor *mo,FTranslatedLineTarget *pLineTarget,int aimflags)

{
  bool bVar1;
  uint in_ECX;
  undefined4 in_register_00000014;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  double dVar3;
  TAngle<double> local_68;
  undefined1 local_60 [16];
  TAngle<double> local_50;
  undefined1 local_48 [8];
  FTranslatedLineTarget scratch;
  DAngle an;
  int i;
  int aimflags_local;
  FTranslatedLineTarget *pLineTarget_local;
  AActor *mo_local;
  DAngle *pitch;
  
  _i = (DAngle *)CONCAT44(in_register_00000014,aimflags);
  TAngle<double>::TAngle((TAngle<double> *)&scratch.unlinked);
  TAngle<double>::TAngle((TAngle<double> *)mo);
  FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)local_48);
  if (_i == (DAngle *)0x0) {
    _i = (DAngle *)local_48;
  }
  an.Degrees._0_4_ = 2;
  do {
    TAngle<double>::operator+(&local_50,P_BulletSlope::angdiff[an.Degrees._0_4_]);
    TAngle<double>::operator=((TAngle<double> *)&scratch.unlinked,&local_50);
    TAngle<double>::TAngle((TAngle<double> *)local_60,(TAngle<double> *)&scratch.unlinked);
    TAngle<double>::TAngle(&local_68,0.0);
    P_AimLineAttack((AActor *)(local_60 + 8),(DAngle *)pLineTarget,1024.0,
                    (FTranslatedLineTarget *)local_60,_i,(int)&local_68,(AActor *)(ulong)in_ECX,
                    (AActor *)0x0);
    TAngle<double>::operator=((TAngle<double> *)mo,(TAngle<double> *)(local_60 + 8));
    dVar3 = extraout_XMM0_Qa;
    if ((pLineTarget[0x15].angleFromSource.Degrees != 0.0) &&
       (bVar1 = FLevelLocals::IsFreelookAllowed(&level), dVar3 = extraout_XMM0_Qa_00, bVar1)) {
      dVar2 = userinfo_t::GetAimDist
                        ((userinfo_t *)((long)pLineTarget[0x15].angleFromSource.Degrees + 0x38));
      dVar3 = 0.5;
      if (dVar2 <= 0.5) {
        return (DAngle)0.5;
      }
    }
    bVar1 = false;
    if (_i->Degrees == 0.0) {
      an.Degrees._0_4_ = an.Degrees._0_4_ + -1;
      bVar1 = -1 < an.Degrees._0_4_;
    }
  } while (bVar1);
  return (DAngle)dVar3;
}

Assistant:

DAngle P_BulletSlope (AActor *mo, FTranslatedLineTarget *pLineTarget, int aimflags)
{
	static const double angdiff[3] = { -5.625f, 5.625f, 0 };
	int i;
	DAngle an;
	DAngle pitch;
	FTranslatedLineTarget scratch;

	if (pLineTarget == NULL) pLineTarget = &scratch;
	// see which target is to be aimed at
	i = 2;
	do
	{
		an = mo->Angles.Yaw + angdiff[i];
		pitch = P_AimLineAttack (mo, an, 16.*64, pLineTarget, 0., aimflags);

		if (mo->player != NULL &&
			level.IsFreelookAllowed() &&
			mo->player->userinfo.GetAimDist() <= 0.5)
		{
			break;
		}
	} while (pLineTarget->linetarget == NULL && --i >= 0);

	return pitch;
}